

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

uint32 __thiscall Clasp::SharedContext::problemComplexity(SharedContext *this)

{
  size_type sVar1;
  int iVar2;
  uint32 r;
  uint32 uVar3;
  uint uVar4;
  ulong uVar5;
  Solver *pSVar6;
  
  pSVar6 = *(this->solvers_).ebo_.buf;
  sVar1 = (pSVar6->constraints_).ebo_.size;
  uVar3 = (this->btig_).tern_[0] + (this->btig_).bin_[0];
  if ((this->stats_).vars.frozen == 0) {
    uVar3 = uVar3 + sVar1;
  }
  else if (sVar1 != 0) {
    uVar5 = 0;
    do {
      iVar2 = (*(pSVar6->constraints_).ebo_.buf[uVar5]->_vptr_Constraint[8])();
      uVar3 = uVar3 + iVar2;
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      pSVar6 = *(this->solvers_).ebo_.buf;
    } while (uVar4 != (pSVar6->constraints_).ebo_.size);
  }
  return uVar3;
}

Assistant:

uint32 SharedContext::problemComplexity() const {
	if (isExtended()) {
		uint32 r = numBinary() + numTernary();
		for (uint32 i = 0; i != master()->constraints_.size(); ++i) {
			r += master()->constraints_[i]->estimateComplexity(*master());
		}
		return r;
	}
	return numConstraints();
}